

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O2

void sysbvm_weakValueDictionary_increaseCapacity
               (sysbvm_context_t *context,sysbvm_weakValueDictionary_t **dictionary)

{
  sysbvm_tuple_t sVar1;
  ulong uVar2;
  sysbvm_size_t value;
  size_t i;
  ulong uVar3;
  ulong local_78;
  sysbvm_tuple_t local_70;
  sysbvm_weakValueAssociation_t *psStack_68;
  sysbvm_tuple_t local_60;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  undefined1 *local_40;
  
  local_40 = (undefined1 *)&local_78;
  local_60 = 0;
  local_70 = 0;
  psStack_68 = (sysbvm_weakValueAssociation_t *)0x0;
  local_78 = (*dictionary)->storage;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 4;
  sysbvm_stackFrame_pushRecord(&local_58);
  if ((local_78 & 0xf) == 0 && local_78 != 0) {
    uVar2 = (ulong)(*(uint *)(local_78 + 0xc) >> 3);
  }
  else {
    uVar2 = 0;
  }
  uVar3 = (ulong)(uint)((int)uVar2 * 2);
  sVar1 = 8;
  if (8 < uVar3) {
    sVar1 = uVar3;
  }
  local_70 = sysbvm_array_create(context,sVar1);
  (*dictionary)->storage = local_70;
  value = 0;
  for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    psStack_68 = *(sysbvm_weakValueAssociation_t **)(local_78 + 0x10 + uVar3 * 8);
    if ((psStack_68 != (sysbvm_weakValueAssociation_t *)0x0) && (psStack_68->value != 0x4f)) {
      local_60 = psStack_68->key;
      sysbvm_dictionary_insertNoCheck(context,dictionary,&psStack_68,&local_60);
      value = value + 1;
    }
  }
  sVar1 = sysbvm_tuple_size_encode(context,value);
  (*dictionary)->size = sVar1;
  return;
}

Assistant:

static void sysbvm_weakValueDictionary_increaseCapacity(sysbvm_context_t *context, sysbvm_weakValueDictionary_t **dictionary)
{
    struct {
        sysbvm_array_t *oldStorage;
        sysbvm_array_t *newStorage;
        sysbvm_weakValueAssociation_t *association;
        sysbvm_tuple_t key;
    } gcFrame = {
        .oldStorage = (sysbvm_array_t*)(*dictionary)->storage,
    };
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    size_t oldCapacity = sysbvm_tuple_getSizeInSlots((sysbvm_tuple_t)gcFrame.oldStorage);
    size_t newCapacity = oldCapacity * 2;
    size_t newSize = 0;
    if(newCapacity < 8)
        newCapacity = 8;

    // Make the new storage.
    gcFrame.newStorage = (sysbvm_array_t*)sysbvm_array_create(context, newCapacity);
    (*dictionary)->storage = (sysbvm_tuple_t)gcFrame.newStorage;

    // Reinsert the old elements.
    for(size_t i = 0; i < oldCapacity; ++i)
    {
        gcFrame.association = (sysbvm_weakValueAssociation_t *)gcFrame.oldStorage->elements[i];
        if(gcFrame.association && gcFrame.association->value != SYSBVM_TOMBSTONE_TUPLE)
        {
            gcFrame.key = gcFrame.association->key;
            sysbvm_dictionary_insertNoCheck(context, dictionary, &gcFrame.association, &gcFrame.key);
            ++newSize;
        }
    }

    // We need to recompute the size due to deleted weak objects.
    (*dictionary)->size = sysbvm_tuple_size_encode(context, newSize);
}